

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O0

Result __thiscall
wabt::interp::Memory::AtomicRmwCmpxchg<unsigned_short>
          (Memory *this,u64 offset,u64 addend,unsigned_short expect,unsigned_short replace,
          unsigned_short *out)

{
  bool bVar1;
  Result RVar2;
  unsigned_short local_3a;
  unsigned_short *puStack_38;
  unsigned_short read;
  unsigned_short *out_local;
  unsigned_short replace_local;
  u64 uStack_28;
  unsigned_short expect_local;
  u64 addend_local;
  u64 offset_local;
  Memory *this_local;
  
  puStack_38 = out;
  out_local._4_2_ = replace;
  out_local._6_2_ = expect;
  uStack_28 = addend;
  addend_local = offset;
  offset_local = (u64)this;
  RVar2 = AtomicLoad<unsigned_short>(this,offset,addend,&local_3a);
  bVar1 = Failed(RVar2);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    if (local_3a == out_local._6_2_) {
      RVar2 = AtomicStore<unsigned_short>(this,addend_local,uStack_28,out_local._4_2_);
      bVar1 = Failed(RVar2);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        return (Result)this_local._4_4_;
      }
    }
    *puStack_38 = local_3a;
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result Memory::AtomicRmwCmpxchg(u64 offset,
                                u64 addend,
                                T expect,
                                T replace,
                                T* out) {
  T read;
  CHECK_RESULT(AtomicLoad(offset, addend, &read));
  if (read == expect) {
    CHECK_RESULT(AtomicStore(offset, addend, replace));
  }
  *out = read;
  return Result::Ok;
}